

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_sndio.c
# Opt level: O0

void sndio_stream_destroy(cubeb_stream_conflict2 *s)

{
  void *in_RDI;
  
  (*cubeb_sio_close)(*(sio_hdl **)((long)in_RDI + 0x40));
  if ((*(uint *)((long)in_RDI + 0x48) & 1) != 0) {
    free(*(void **)((long)in_RDI + 0x60));
  }
  if ((*(uint *)((long)in_RDI + 0x48) & 2) != 0) {
    free(*(void **)((long)in_RDI + 0x58));
  }
  free(in_RDI);
  return;
}

Assistant:

static void
sndio_stream_destroy(cubeb_stream *s)
{
  DPR("sndio_stream_destroy()\n");
  WRAP(sio_close)(s->hdl);
  if (s->mode & SIO_PLAY)
    free(s->pbuf);
  if (s->mode & SIO_REC)
    free(s->rbuf);
  free(s);
}